

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

CutoffGroup * __thiscall
OpenMD::MoleculeCreator::createCutoffGroup
          (MoleculeCreator *this,Molecule *param_2,Atom *atom,LocalIndexManager *localIndexMan)

{
  int index;
  CutoffGroup *this_00;
  CutoffGroup *cg;
  Atom *in_stack_ffffffffffffffb8;
  CutoffGroup *this_01;
  
  this_00 = (CutoffGroup *)operator_new(0x40);
  CutoffGroup::CutoffGroup(this_00);
  CutoffGroup::addAtom(this_00,in_stack_ffffffffffffffb8);
  this_01 = this_00;
  index = LocalIndexManager::getNextCutoffGroupIndex((LocalIndexManager *)0x2256f0);
  CutoffGroup::setLocalIndex(this_01,index);
  return this_00;
}

Assistant:

CutoffGroup* MoleculeCreator::createCutoffGroup(
      Molecule*, Atom* atom, LocalIndexManager* localIndexMan) {
    CutoffGroup* cg;
    cg = new CutoffGroup();
    cg->addAtom(atom);

    // set the local index of this cutoffGroup, global index will be set later
    cg->setLocalIndex(localIndexMan->getNextCutoffGroupIndex());

    return cg;
  }